

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Pring *pPVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  Pring *pPVar10;
  Pring *pPVar11;
  int *piVar12;
  int *piVar13;
  Pring *pPVar14;
  pointer pnVar15;
  int *piVar16;
  Pring *pPVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int *piVar21;
  int iVar22;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  pPVar17 = (this->temp).pivot_colNZ;
  pPVar6 = pPVar17 + 1;
  while( true ) {
    pPVar6 = pPVar6->prev;
    pPVar10 = pPVar17 + 1;
    if (pPVar6 == pPVar10) break;
    iVar2 = pPVar6->idx;
    piVar7 = (this->u).col.len;
    iVar3 = piVar7[iVar2];
    piVar7[iVar2] = iVar3 + -1;
    piVar8 = (this->u).col.idx;
    piVar9 = (this->u).col.start;
    iVar3 = piVar8[(long)piVar9[iVar2] + -1 + (long)iVar3];
    pPVar10 = (this->temp).pivot_row;
    pPVar11 = pPVar10[iVar3].next;
    pPVar10 = pPVar10[iVar3].prev;
    pPVar11->prev = pPVar10;
    pPVar10->next = pPVar11;
    piVar12 = (this->u).row.len;
    iVar18 = piVar12[iVar3] + -1;
    piVar12[iVar3] = iVar18;
    piVar12 = (this->u).row.idx;
    piVar13 = (this->temp).s_cact;
    pPVar10 = (this->temp).pivot_col;
    lVar19 = (long)(iVar18 + (this->u).row.start[iVar3]);
    for (lVar20 = lVar19; iVar18 = piVar12[lVar20], iVar18 != iVar2; lVar20 = lVar20 + -1) {
      iVar4 = piVar9[iVar18];
      iVar5 = piVar7[iVar18];
      iVar22 = piVar13[iVar18];
      piVar13[iVar18] = iVar22 + -1;
      iVar22 = (iVar4 + iVar5) - iVar22;
      piVar16 = piVar8 + iVar22;
      do {
        piVar21 = piVar16;
        piVar16 = piVar21 + 1;
      } while (*piVar21 != iVar3);
      *piVar21 = piVar8[iVar22];
      piVar8[iVar22] = iVar3;
      iVar4 = piVar13[iVar18];
      pPVar11 = pPVar10[iVar18].next;
      pPVar14 = pPVar10[iVar18].prev;
      pPVar11->prev = pPVar14;
      pPVar14->next = pPVar11;
      pPVar11 = pPVar17[iVar4].next;
      pPVar10[iVar18].next = pPVar11;
      pPVar11->prev = pPVar10 + iVar18;
      pPVar10[iVar18].prev = pPVar17 + iVar4;
      pPVar17[iVar4].next = pPVar10 + iVar18;
    }
    iVar18 = (this->temp).stage;
    (this->temp).stage = iVar18 + 1;
    pnVar15 = (this->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)pnVar15[lVar20].m_backend.data._M_elems;
    local_88.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)pnVar15[lVar20].m_backend.data._M_elems + 8);
    puVar1 = (uint *)((long)pnVar15[lVar20].m_backend.data._M_elems + 0x10);
    local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar15[lVar20].m_backend.data._M_elems + 0x20);
    local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar15[lVar20].m_backend.data._M_elems + 0x30);
    local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_88.m_backend.exp = pnVar15[lVar20].m_backend.exp;
    local_88.m_backend.neg = pnVar15[lVar20].m_backend.neg;
    local_88.m_backend.fpclass = pnVar15[lVar20].m_backend.fpclass;
    local_88.m_backend.prec_elem = pnVar15[lVar20].m_backend.prec_elem;
    setPivot(this,iVar18,iVar2,iVar3,&local_88);
    piVar7 = (this->u).row.idx;
    piVar7[lVar20] = piVar7[lVar19];
    pnVar15 = (this->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar15[lVar20].m_backend,&pnVar15[lVar19].m_backend);
    piVar7 = (this->u).row.idx;
    iVar2 = (this->u).row.start[iVar3];
    piVar8 = (this->u).col.len;
    piVar9 = (this->u).col.start;
    piVar12 = (this->temp).s_cact;
    piVar13 = (this->u).col.idx;
    pPVar10 = (this->temp).pivot_col;
    pPVar17 = (this->temp).pivot_colNZ;
    while (iVar2 < lVar20) {
      lVar20 = lVar20 + -1;
      iVar18 = piVar7[lVar20];
      iVar4 = piVar9[iVar18];
      iVar5 = piVar8[iVar18];
      iVar22 = piVar12[iVar18];
      piVar12[iVar18] = iVar22 + -1;
      iVar22 = (iVar4 + iVar5) - iVar22;
      piVar16 = piVar13 + iVar22;
      do {
        piVar21 = piVar16;
        piVar16 = piVar21 + 1;
      } while (*piVar21 != iVar3);
      *piVar21 = piVar13[iVar22];
      piVar13[iVar22] = iVar3;
      iVar4 = piVar12[iVar18];
      pPVar11 = pPVar10[iVar18].next;
      pPVar14 = pPVar10[iVar18].prev;
      pPVar11->prev = pPVar14;
      pPVar14->next = pPVar11;
      pPVar11 = pPVar17[iVar4].next;
      pPVar10[iVar18].next = pPVar11;
      pPVar11->prev = pPVar10 + iVar18;
      pPVar10[iVar18].prev = pPVar17 + iVar4;
      pPVar17[iVar4].next = pPVar10 + iVar18;
    }
  }
  pPVar17[1].next = pPVar10;
  pPVar17[1].prev = pPVar10;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}